

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O2

void __thiscall
vkt::sr::ShaderRenderCaseInstance::createSamplerUniform
          (ShaderRenderCaseInstance *this,deUint32 bindingLocation,Type textureType,Init textureInit
          ,TextureFormat *texFormat,UVec3 texSize,TextureData *textureData,Sampler *refSampler,
          deUint32 mipLevels,deUint32 arrayLayers,Parameters textureParams)

{
  int iVar1;
  Allocator *pAVar2;
  long lVar3;
  UVec3 texSize_00;
  SamplerUniform *pSVar4;
  Handle<(vk::HandleType)9> sparseImage;
  Allocation *ptr;
  Handle<(vk::HandleType)13> HVar5;
  Handle<(vk::HandleType)20> HVar6;
  VkFormat VVar7;
  VkResult result;
  VkDevice device;
  DeviceInterface *vk;
  Unique<vk::Handle<(vk::HandleType)9>_> *ptr_00;
  Unique<vk::Handle<(vk::HandleType)13>_> *ptr_01;
  Unique<vk::Handle<(vk::HandleType)20>_> *ptr_02;
  UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>
  *ptr_03;
  VkImageType imageType;
  VkImageViewType VVar8;
  uint uVar9;
  undefined4 in_stack_00000014;
  VkComponentSwizzle in_stack_0000002c;
  uint uVar10;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> in_stack_fffffffffffffdf8;
  MovePtr<vkt::sr::ShaderRenderCaseInstance::SamplerUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SamplerUniform>_>
  uniform;
  Move<vk::Handle<(vk::HandleType)9>_> vkTexture;
  deUint32 queueFamilyIndex;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> allocation;
  Move<vk::Handle<(vk::HandleType)13>_> imageView;
  Move<vk::Handle<(vk::HandleType)20>_> sampler;
  Vector<unsigned_int,_3> local_134;
  undefined1 local_128 [16];
  VkDevice local_118;
  VkImage VStack_110;
  VkImageViewType local_108;
  VkFormat local_104;
  undefined1 local_100 [16];
  VkImageAspectFlags local_f0;
  deUint32 local_ec;
  deUint32 local_e8;
  deUint32 local_e4;
  deUint32 local_e0;
  VkSamplerCreateInfo samplerParams;
  undefined1 local_88 [36];
  deUint32 local_64;
  deUint32 local_60;
  deUint32 local_5c;
  VkSampleCountFlagBits local_58;
  undefined8 local_54;
  undefined8 uStack_4c;
  deUint32 *local_40;
  VkImageLayout local_38;
  
  lVar3 = CONCAT44(in_stack_00000014,texSize.m_data[2]);
  device = getDevice(this);
  vk = getDeviceInterface(this);
  queueFamilyIndex = getUniversalQueueFamilyIndex(this);
  iVar1 = *(int *)(lVar3 + 0x1c);
  uVar10 = textureType - TYPE_2D;
  VVar8 = VK_IMAGE_VIEW_TYPE_1D;
  imageType = VK_IMAGE_TYPE_1D;
  uVar9 = 0;
  if (uVar10 < 6) {
    VVar8 = textureType - VK_IMAGE_VIEW_TYPE_2D;
    imageType = *(VkImageType *)(&DAT_009c2d30 + (ulong)uVar10 * 4);
    uVar9 = *(uint *)(&DAT_009c2d48 + (ulong)uVar10 * 4);
  }
  VVar7 = ::vk::mapTextureFormat(texFormat);
  allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
       (Allocation *)0x0;
  vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device = (VkDevice)0x0;
  vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  if (this->m_imageBackingMode == IMAGE_BACKING_MODE_SPARSE) {
    checkSparseSupport(this,imageType);
    uVar9 = uVar9 | 3;
  }
  local_88._0_4_ = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  local_88._8_8_ = (void *)0x0;
  local_88._28_8_ =
       (textureData->
       super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_64 = *(deUint32 *)
              &(textureData->
               super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
  local_60 = (deUint32)refSampler;
  local_5c = mipLevels;
  local_58 = textureParams.componentMapping.b;
  local_54._0_4_ = VK_IMAGE_TILING_OPTIMAL;
  local_54._4_4_ = 6;
  uStack_4c._0_4_ = VK_SHARING_MODE_EXCLUSIVE;
  uStack_4c._4_4_ = 1;
  local_40 = &queueFamilyIndex;
  local_38 = VK_IMAGE_LAYOUT_UNDEFINED;
  local_88._16_4_ = uVar9;
  local_88._20_4_ = imageType;
  local_88._24_4_ = VVar7;
  ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)local_128,vk,device,
                    (VkImageCreateInfo *)local_88,(VkAllocationCallbacks *)0x0);
  samplerParams._16_8_ = local_118;
  samplerParams.minFilter = (undefined4)VStack_110.m_internal;
  samplerParams.mipmapMode = VStack_110.m_internal._4_4_;
  samplerParams._0_8_ = local_128._0_8_;
  samplerParams.pNext = (void *)local_128._8_8_;
  local_128._0_8_ = 0;
  local_128._8_8_ = (DeviceInterface *)0x0;
  local_118 = (VkDevice)0x0;
  VStack_110.m_internal = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::reset
            (&vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)samplerParams._16_8_;
  vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)samplerParams._24_8_;
  vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal =
       samplerParams._0_8_;
  vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)samplerParams.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)9>_> *)local_128);
  pAVar2 = this->m_memAlloc;
  ::vk::getImageMemoryRequirements
            ((VkMemoryRequirements *)&samplerParams,vk,device,
             (VkImage)vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                      m_internal);
  (*pAVar2->_vptr_Allocator[3])(local_128,pAVar2,&samplerParams,0);
  local_128._0_8_ = 0;
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::assignData
            (&allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>,
             in_stack_fffffffffffffdf8);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_128);
  if (this->m_imageBackingMode != IMAGE_BACKING_MODE_SPARSE) {
    result = (*vk->_vptr_DeviceInterface[0xd])
                       (vk,device,
                        vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                        m_internal,
                        ((allocation.
                          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                          m_data.ptr)->m_memory).m_internal);
    ::vk::checkResult(result,
                      "vk.bindImageMemory(vkDevice, *vkTexture, allocation->getMemory(), allocation->getOffset())"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                      ,0x818);
  }
  sparseImage.m_internal =
       vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  if (textureInit == INIT_CLEAR) {
    clearImage(this,(Sampler *)CONCAT44(in_stack_00000014,texSize.m_data[2]),(deUint32)refSampler,
               mipLevels,
               (VkImage)vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                        m_internal);
  }
  else if (textureInit == INIT_UPLOAD_DATA) {
    if (this->m_imageBackingMode == IMAGE_BACKING_MODE_SPARSE) {
      uVar10 = 0x636392;
      tcu::Vector<unsigned_int,_3>::Vector(&local_134,(Vector<unsigned_int,_3> *)textureData);
      texSize_00.m_data[2] = uVar10;
      texSize_00.m_data._0_8_ = &local_134;
      uploadSparseImage(this,texFormat,(TextureData *)texSize.m_data._0_8_,
                        (Sampler *)CONCAT44(in_stack_00000014,texSize.m_data[2]),
                        (deUint32)refSampler,mipLevels,(VkImage)sparseImage.m_internal,
                        (VkImageCreateInfo *)local_88,texSize_00);
    }
    else {
      uploadImage(this,texFormat,(TextureData *)texSize.m_data._0_8_,
                  (Sampler *)CONCAT44(in_stack_00000014,texSize.m_data[2]),(deUint32)refSampler,
                  mipLevels,
                  (VkImage)vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                           m_internal);
    }
  }
  ::vk::mapSampler(&samplerParams,(Sampler *)CONCAT44(in_stack_00000014,texSize.m_data[2]),texFormat
                   ,0.0,1000.0);
  ::vk::createSampler(&sampler,vk,device,&samplerParams,(VkAllocationCallbacks *)0x0);
  local_100._4_4_ = textureParams.baseMipLevel;
  local_100._0_4_ = in_stack_0000002c;
  local_100._8_4_ = textureParams.componentMapping.r;
  local_100._12_4_ = textureParams.componentMapping.g;
  local_128._0_4_ = 0xf;
  local_128._8_8_ = (DeviceInterface *)0x0;
  local_118 = (VkDevice)((ulong)local_118 & 0xffffffff00000000);
  VStack_110.m_internal =
       vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  local_ec = arrayLayers;
  local_e8 = (deUint32)refSampler - arrayLayers;
  local_e4 = 0;
  local_e0 = mipLevels;
  local_108 = VVar8;
  local_104 = VVar7;
  local_f0 = 2 - (iVar1 == 0);
  ::vk::createImageView
            (&imageView,vk,device,(VkImageViewCreateInfo *)local_128,(VkAllocationCallbacks *)0x0);
  HVar6 = sampler.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object;
  HVar5 = imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object;
  uniform.
  super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SamplerUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SamplerUniform>_>
  .m_data.ptr = (SamplerUniform *)operator_new(0x68);
  ((uniform.
    super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SamplerUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SamplerUniform>_>
    .m_data.ptr)->super_UniformInfo)._vptr_UniformInfo = (_func_int **)&PTR__SamplerUniform_00c00e70
  ;
  ((uniform.
    super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SamplerUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SamplerUniform>_>
    .m_data.ptr)->image).m_ptr = (Unique<vk::Handle<(vk::HandleType)9>_> *)0x0;
  ((uniform.
    super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SamplerUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SamplerUniform>_>
    .m_data.ptr)->image).m_state = (SharedPtrStateBase *)0x0;
  ((uniform.
    super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SamplerUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SamplerUniform>_>
    .m_data.ptr)->imageView).m_ptr = (Unique<vk::Handle<(vk::HandleType)13>_> *)0x0;
  ((uniform.
    super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SamplerUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SamplerUniform>_>
    .m_data.ptr)->imageView).m_state = (SharedPtrStateBase *)0x0;
  ((uniform.
    super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SamplerUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SamplerUniform>_>
    .m_data.ptr)->sampler).m_ptr = (Unique<vk::Handle<(vk::HandleType)20>_> *)0x0;
  ((uniform.
    super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SamplerUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SamplerUniform>_>
    .m_data.ptr)->sampler).m_state = (SharedPtrStateBase *)0x0;
  ((uniform.
    super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SamplerUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SamplerUniform>_>
    .m_data.ptr)->alloc).m_ptr = (Allocation *)0x0;
  ((uniform.
    super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SamplerUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SamplerUniform>_>
    .m_data.ptr)->alloc).m_state = (SharedPtrStateBase *)0x0;
  ((uniform.
    super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SamplerUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SamplerUniform>_>
    .m_data.ptr)->super_UniformInfo).type = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
  ((uniform.
    super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SamplerUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SamplerUniform>_>
    .m_data.ptr)->descriptor).sampler.m_internal = HVar6.m_internal;
  ((uniform.
    super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SamplerUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SamplerUniform>_>
    .m_data.ptr)->descriptor).imageView.m_internal = HVar5.m_internal;
  ((uniform.
    super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SamplerUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SamplerUniform>_>
    .m_data.ptr)->descriptor).imageLayout = VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL;
  ((uniform.
    super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SamplerUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SamplerUniform>_>
    .m_data.ptr)->super_UniformInfo).location = bindingLocation;
  ptr_00 = (Unique<vk::Handle<(vk::HandleType)9>_> *)operator_new(0x20);
  (ptr_00->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.deleter.m_device =
       vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device;
  (ptr_00->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.deleter.m_allocator =
       vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator;
  (ptr_00->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal =
       vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  (ptr_00->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.deleter.m_deviceIface =
       vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface;
  vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device = (VkDevice)0x0;
  vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>::SharedPtr
            ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_> *)
             &stack0xfffffffffffffe00,ptr_00);
  de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>::operator=
            (&(uniform.
               super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SamplerUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SamplerUniform>_>
               .m_data.ptr)->image,
             (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_> *)
             &stack0xfffffffffffffe00);
  de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>::release
            ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_> *)
             &stack0xfffffffffffffe00);
  ptr_01 = (Unique<vk::Handle<(vk::HandleType)13>_> *)operator_new(0x20);
  (ptr_01->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_device =
       imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
  (ptr_01->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_allocator =
       imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  (ptr_01->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
       imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  (ptr_01->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_deviceIface =
       imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
  imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
  imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device = (VkDevice)0x0;
  imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::SharedPtr
            ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)
             &stack0xfffffffffffffe00,ptr_01);
  de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::operator=
            (&(uniform.
               super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SamplerUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SamplerUniform>_>
               .m_data.ptr)->imageView,
             (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)
             &stack0xfffffffffffffe00);
  de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::release
            ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)
             &stack0xfffffffffffffe00);
  ptr_02 = (Unique<vk::Handle<(vk::HandleType)20>_> *)operator_new(0x20);
  (ptr_02->super_RefBase<vk::Handle<(vk::HandleType)20>_>).m_data.deleter.m_device =
       sampler.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_device;
  (ptr_02->super_RefBase<vk::Handle<(vk::HandleType)20>_>).m_data.deleter.m_allocator =
       sampler.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_allocator;
  (ptr_02->super_RefBase<vk::Handle<(vk::HandleType)20>_>).m_data.object.m_internal =
       sampler.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.m_internal;
  (ptr_02->super_RefBase<vk::Handle<(vk::HandleType)20>_>).m_data.deleter.m_deviceIface =
       sampler.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_deviceIface;
  sampler.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.m_internal = 0;
  sampler.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  sampler.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_device = (VkDevice)0x0;
  sampler.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)20>_>_>::SharedPtr
            ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)20>_>_> *)
             &stack0xfffffffffffffe00,ptr_02);
  de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)20>_>_>::operator=
            (&(uniform.
               super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SamplerUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SamplerUniform>_>
               .m_data.ptr)->sampler,
             (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)20>_>_> *)
             &stack0xfffffffffffffe00);
  de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)20>_>_>::release
            ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)20>_>_> *)
             &stack0xfffffffffffffe00);
  ptr = allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
       (Allocation *)0x0;
  de::SharedPtr<vk::Allocation>::SharedPtr
            ((SharedPtr<vk::Allocation> *)&stack0xfffffffffffffe00,ptr);
  de::SharedPtr<vk::Allocation>::operator=
            (&(uniform.
               super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SamplerUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SamplerUniform>_>
               .m_data.ptr)->alloc,(SharedPtr<vk::Allocation> *)&stack0xfffffffffffffe00);
  de::SharedPtr<vk::Allocation>::release((SharedPtr<vk::Allocation> *)&stack0xfffffffffffffe00);
  ::vk::DescriptorSetLayoutBuilder::addSingleSamplerBinding
            ((this->m_descriptorSetLayoutBuilder).
             super_UniqueBase<vk::DescriptorSetLayoutBuilder,_de::DefaultDeleter<vk::DescriptorSetLayoutBuilder>_>
             .m_data.ptr,VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,0x7fffffff,(VkSampler *)0x0);
  ::vk::DescriptorPoolBuilder::addType
            ((this->m_descriptorPoolBuilder).
             super_UniqueBase<vk::DescriptorPoolBuilder,_de::DefaultDeleter<vk::DescriptorPoolBuilder>_>
             .m_data.ptr,VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,1);
  ptr_03 = (UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>
            *)operator_new(0x10);
  pSVar4 = uniform.
           super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SamplerUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SamplerUniform>_>
           .m_data.ptr;
  uniform.
  super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SamplerUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SamplerUniform>_>
  .m_data.ptr = (SamplerUniform *)0x0;
  (ptr_03->
  super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>
  ).m_data.ptr = &pSVar4->super_UniformInfo;
  de::
  SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>_>
  ::SharedPtr((SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>_>
               *)&stack0xfffffffffffffe00,ptr_03);
  std::
  vector<de::SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>>>,std::allocator<de::SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>>>>>
  ::
  emplace_back<de::SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>>>>
            ((vector<de::SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>>>,std::allocator<de::SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>>>>>
              *)&this->m_uniformInfos,
             (SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>_>
              *)&stack0xfffffffffffffe00);
  de::
  SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>_>
  ::release((SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>_>
             *)&stack0xfffffffffffffe00);
  de::details::
  UniqueBase<vkt::sr::ShaderRenderCaseInstance::SamplerUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SamplerUniform>_>
  ::~UniqueBase(&uniform.
                 super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SamplerUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SamplerUniform>_>
               );
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
            (&imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)20>_>::~RefBase
            (&sampler.super_RefBase<vk::Handle<(vk::HandleType)20>_>);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            (&allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase
            (&vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  return;
}

Assistant:

void ShaderRenderCaseInstance::createSamplerUniform (deUint32						bindingLocation,
													 TextureBinding::Type			textureType,
													 TextureBinding::Init			textureInit,
													 const tcu::TextureFormat&		texFormat,
													 const tcu::UVec3				texSize,
													 const TextureData&				textureData,
													 const tcu::Sampler&			refSampler,
													 deUint32						mipLevels,
													 deUint32						arrayLayers,
													 TextureBinding::Parameters		textureParams)
{
	const VkDevice					vkDevice			= getDevice();
	const DeviceInterface&			vk					= getDeviceInterface();
	const deUint32					queueFamilyIndex	= getUniversalQueueFamilyIndex();

	const bool						isShadowSampler		= refSampler.compare != tcu::Sampler::COMPAREMODE_NONE;
	const VkImageAspectFlags		aspectMask			= isShadowSampler ? VK_IMAGE_ASPECT_DEPTH_BIT : VK_IMAGE_ASPECT_COLOR_BIT;
	const VkImageViewType			imageViewType		= textureTypeToImageViewType(textureType);
	const VkImageType				imageType			= viewTypeToImageType(imageViewType);
	const VkFormat					format				= mapTextureFormat(texFormat);
	const bool						isCube				= imageViewType == VK_IMAGE_VIEW_TYPE_CUBE || imageViewType == VK_IMAGE_VIEW_TYPE_CUBE_ARRAY;
	VkImageCreateFlags				imageCreateFlags	= isCube ? (VkImageCreateFlags)VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT : (VkImageCreateFlags)0;
	VkImageUsageFlags				imageUsageFlags		= VK_IMAGE_USAGE_SAMPLED_BIT | VK_IMAGE_USAGE_TRANSFER_DST_BIT;
	Move<VkImage>					vkTexture;
	de::MovePtr<Allocation>			allocation;

	if (m_imageBackingMode == IMAGE_BACKING_MODE_SPARSE)
	{
		checkSparseSupport(imageType);
		imageCreateFlags |= VK_IMAGE_CREATE_SPARSE_BINDING_BIT | VK_IMAGE_CREATE_SPARSE_RESIDENCY_BIT;
	}

	// Create image
	const VkImageCreateInfo			imageParams =
	{
		VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,							// VkStructureType			sType;
		DE_NULL,														// const void*				pNext;
		imageCreateFlags,												// VkImageCreateFlags		flags;
		imageType,														// VkImageType				imageType;
		format,															// VkFormat					format;
		{																// VkExtent3D				extent;
			texSize.x(),
			texSize.y(),
			texSize.z()
		},
		mipLevels,														// deUint32					mipLevels;
		arrayLayers,													// deUint32					arrayLayers;
		textureParams.samples,											// VkSampleCountFlagBits	samples;
		VK_IMAGE_TILING_OPTIMAL,										// VkImageTiling			tiling;
		imageUsageFlags,												// VkImageUsageFlags		usage;
		VK_SHARING_MODE_EXCLUSIVE,										// VkSharingMode			sharingMode;
		1u,																// deUint32					queueFamilyIndexCount;
		&queueFamilyIndex,												// const deUint32*			pQueueFamilyIndices;
		VK_IMAGE_LAYOUT_UNDEFINED										// VkImageLayout			initialLayout;
	};

	vkTexture		= createImage(vk, vkDevice, &imageParams);
	allocation		= m_memAlloc.allocate(getImageMemoryRequirements(vk, vkDevice, *vkTexture), MemoryRequirement::Any);

	if (m_imageBackingMode != IMAGE_BACKING_MODE_SPARSE)
	{
		VK_CHECK(vk.bindImageMemory(vkDevice, *vkTexture, allocation->getMemory(), allocation->getOffset()));
	}

	switch (textureInit)
	{
		case TextureBinding::INIT_UPLOAD_DATA:
		{
			// upload*Image functions use cmdCopyBufferToImage, which is invalid for multisample images
			DE_ASSERT(textureParams.samples == VK_SAMPLE_COUNT_1_BIT);

			if (m_imageBackingMode == IMAGE_BACKING_MODE_SPARSE)
			{
				uploadSparseImage(texFormat, textureData, refSampler, mipLevels, arrayLayers, *vkTexture, imageParams, texSize);
			}
			else
			{
				// Upload texture data
				uploadImage(texFormat, textureData, refSampler, mipLevels, arrayLayers, *vkTexture);
			}
			break;
		}
		case TextureBinding::INIT_CLEAR:
			clearImage(refSampler, mipLevels, arrayLayers, *vkTexture);
			break;
		default:
			DE_FATAL("Impossible");
	}

	// Create sampler
	const VkSamplerCreateInfo		samplerParams	= mapSampler(refSampler, texFormat);
	Move<VkSampler>					sampler			= createSampler(vk, vkDevice, &samplerParams);
	const deUint32					baseMipLevel	= textureParams.baseMipLevel;
	const vk::VkComponentMapping	components		= textureParams.componentMapping;
	const VkImageViewCreateInfo		viewParams		=
	{
		VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,	// VkStructureType			sType;
		NULL,										// const voide*				pNext;
		0u,											// VkImageViewCreateFlags	flags;
		*vkTexture,									// VkImage					image;
		imageViewType,								// VkImageViewType			viewType;
		format,										// VkFormat					format;
		components,									// VkChannelMapping			channels;
		{
			aspectMask,						// VkImageAspectFlags	aspectMask;
			baseMipLevel,					// deUint32				baseMipLevel;
			mipLevels - baseMipLevel,		// deUint32				mipLevels;
			0,								// deUint32				baseArraySlice;
			arrayLayers						// deUint32				arraySize;
		},											// VkImageSubresourceRange	subresourceRange;
	};

	Move<VkImageView>				imageView		= createImageView(vk, vkDevice, &viewParams);

	const vk::VkDescriptorImageInfo	descriptor		=
	{
		sampler.get(),								// VkSampler				sampler;
		imageView.get(),							// VkImageView				imageView;
		VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL,	// VkImageLayout			imageLayout;
	};

	de::MovePtr<SamplerUniform> uniform(new SamplerUniform());
	uniform->type = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
	uniform->descriptor = descriptor;
	uniform->location = bindingLocation;
	uniform->image = VkImageSp(new vk::Unique<VkImage>(vkTexture));
	uniform->imageView = VkImageViewSp(new vk::Unique<VkImageView>(imageView));
	uniform->sampler = VkSamplerSp(new vk::Unique<VkSampler>(sampler));
	uniform->alloc = AllocationSp(allocation.release());

	m_descriptorSetLayoutBuilder->addSingleSamplerBinding(VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, vk::VK_SHADER_STAGE_ALL, DE_NULL);
	m_descriptorPoolBuilder->addType(VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER);

	m_uniformInfos.push_back(UniformInfoSp(new de::UniquePtr<UniformInfo>(uniform)));
}